

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_device.cpp
# Opt level: O3

void __thiscall embree::ISPCGridMesh::~ISPCGridMesh(ISPCGridMesh *this)

{
  Vec3fa **ptr;
  ulong uVar1;
  
  ptr = this->positions;
  if (ptr != (Vec3fa **)0x0) {
    if (this->numTimeSteps != 0) {
      uVar1 = 0;
      do {
        alignedUSMFree(this->positions[uVar1]);
        uVar1 = uVar1 + 1;
      } while (uVar1 < this->numTimeSteps);
      ptr = this->positions;
    }
    alignedUSMFree(ptr);
  }
  alignedUSMFree(this->grids);
  ISPCGeometry::~ISPCGeometry(&this->geom);
  return;
}

Assistant:

ISPCGridMesh::~ISPCGridMesh ()
  {
    if (positions) {
      for (size_t i=0; i<numTimeSteps; i++) alignedUSMFree(positions[i]);
      alignedUSMFree(positions);
    }

    alignedUSMFree(grids);
  }